

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point3f __thiscall pbrt::detail::Stratified3DIter::operator*(Stratified3DIter *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM6 [64];
  Point3f PVar16;
  
  iVar1 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).
          super_IndexingIterator<pbrt::detail::Stratified3DIter>.i;
  iVar2 = this->nx;
  iVar3 = this->ny;
  uVar4 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.state;
  uVar5 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.inc;
  uVar8 = uVar4 * 0x5851f42d4c957f2d + uVar5;
  uVar9 = uVar8 * 0x5851f42d4c957f2d + uVar5;
  uVar10 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar8;
  auVar14 = vpunpcklqdq_avx(auVar15,auVar12);
  auVar11 = vpsrlvq_avx2(auVar14,_DAT_005655d0);
  auVar12 = vpsrlvq_avx2(auVar14,_DAT_005655c0);
  auVar11 = vpshufd_avx(auVar12 ^ auVar11,0xe8);
  auVar14 = vpsrlq_avx(auVar14,0x3b);
  auVar14 = vpshufd_avx(auVar14,0xe8);
  auVar11 = vprorvd_avx512vl(auVar11,auVar14);
  auVar14 = vcvtudq2ps_avx512vl(auVar11);
  auVar11._8_4_ = 0x2f800000;
  auVar11._0_8_ = 0x2f8000002f800000;
  auVar11._12_4_ = 0x2f800000;
  auVar12 = vmulps_avx512vl(auVar14,auVar11);
  auVar14._8_4_ = 0x3f7fffff;
  auVar14._0_8_ = 0x3f7fffff3f7fffff;
  auVar14._12_4_ = 0x3f7fffff;
  uVar4 = vcmpps_avx512vl(auVar12,auVar14,1);
  bVar6 = (byte)(uVar4 >> 1);
  auVar11 = vmovshdup_avx(auVar12);
  bVar7 = (byte)(uVar9 >> 0x3b);
  auVar14 = vcvtusi2ss_avx512f(in_ZMM6._0_16_,uVar10 >> bVar7 | uVar10 << 0x20 - bVar7);
  auVar14 = vminss_avx(ZEXT416((uint)(auVar14._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0)
                      );
  auVar13._0_4_ =
       ((float)((uint)(bVar6 & 1) * auVar11._0_4_ + (uint)!(bool)(bVar6 & 1) * 0x3f7fffff) +
       (float)(iVar1 % iVar2)) / (float)iVar2;
  auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar11 = vinsertps_avx(auVar13,ZEXT416((uint)(((float)((uint)((byte)uVar4 & 1) * auVar12._0_4_ +
                                                         (uint)!(bool)((byte)uVar4 & 1) * 0x3f7fffff
                                                         ) +
                                                 (float)(int)((long)((ulong)(uint)((int)((long)iVar1
                                                                                        / (long)
                                                  iVar2) >> 0x1f) << 0x20 |
                                                  (long)iVar1 / (long)iVar2 & 0xffffffffU) %
                                                  (long)iVar3)) / (float)iVar3)),0x10);
  (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.state =
       uVar9 * 0x5851f42d4c957f2d + uVar5;
  PVar16.super_Tuple3<pbrt::Point3,_float>.z =
       (auVar14._0_4_ + (float)(iVar1 / (iVar3 * iVar2))) / (float)this->nz;
  PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar11._0_8_;
  return (Point3f)PVar16.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        int ix = i % nx;
        int iy = (i / nx) % ny;
        int iz = i / (nx * ny);
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny,
                (iz + rng.Uniform<Float>()) / nz};
    }